

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumToPool
               (EnumDescriptor *en,Printer *printer)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  long lVar5;
  string local_90;
  string local_70;
  string local_50;
  
  DescriptorFullName<google::protobuf::EnumDescriptor>(&local_90,en,true);
  io::Printer::Print<char[5],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,
             "$pool->addEnum(\'^name^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n",
             (char (*) [5])0x3ea8a1,&local_90,(char (*) [11])0x3dd31b,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(en + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (0 < *(int *)(en + 4)) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(en + 0x28);
      ConstantNamePrefix(&local_50,(anon_unknown_2 *)**(undefined8 **)(lVar1 + lVar4),
                         (string *)(*(undefined8 **)(lVar1 + lVar4))[1]);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,**(ulong **)(lVar1 + lVar4));
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_90.field_2._M_allocated_capacity = *psVar3;
        local_90.field_2._8_8_ = plVar2[3];
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar3;
        local_90._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_90._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      (anonymous_namespace)::IntToString_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)(ulong)*(uint *)(lVar1 + -4 + lVar4),
                 (int32)local_90._M_string_length);
      io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,"->value(\"^name^\", ^number^)\n",(char (*) [5])0x3ea8a1,&local_90,
                 (char (*) [7])0x3ff2bd,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar5 < *(int *)(en + 4));
  }
  io::Printer::Print<>(printer,"->finalizeToPool();\n\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  return;
}

Assistant:

void GenerateEnumToPool(const EnumDescriptor* en, io::Printer* printer) {
  printer->Print(
      "$pool->addEnum('^name^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "name", DescriptorFullName(en, true),
      "class_name", en->name());
  Indent(printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
        "->value(\"^name^\", ^number^)\n",
        "name", ConstantNamePrefix(value->name()) + value->name(),
        "number", IntToString(value->number()));
  }
  printer->Print("->finalizeToPool();\n\n");
  Outdent(printer);
}